

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

bool __thiscall
pybind11::detail::type_caster<bool,_void>::load
          (type_caster<bool,_void> *this,handle src,bool convert)

{
  PyNumberMethods *pPVar1;
  inquiry p_Var2;
  int iVar3;
  uint uVar4;
  
  if (src.m_ptr == (PyObject *)0x0) {
    return false;
  }
  if (src.m_ptr == (PyObject *)&_Py_TrueStruct) {
    this->value = true;
  }
  else {
    if (src.m_ptr != (PyObject *)&_Py_FalseStruct) {
      if ((convert) || (iVar3 = strcmp("numpy.bool_",(src.m_ptr)->ob_type->tp_name), iVar3 == 0)) {
        if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
          uVar4 = 0;
        }
        else {
          pPVar1 = (src.m_ptr)->ob_type->tp_as_number;
          uVar4 = 0xffffffff;
          if ((pPVar1 != (PyNumberMethods *)0x0) &&
             (p_Var2 = pPVar1->nb_bool, p_Var2 != (inquiry)0x0)) {
            uVar4 = (*p_Var2)(src.m_ptr);
          }
        }
        if (uVar4 < 2) {
          this->value = SUB41(uVar4,0);
          return true;
        }
        PyErr_Clear();
      }
      return false;
    }
    this->value = false;
  }
  return true;
}

Assistant:

explicit operator bool() const { return m_ptr != nullptr; }